

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

StorageClass __thiscall
spirv_cross::Compiler::get_expression_effective_storage_class(Compiler *this,uint32_t ptr)

{
  Variant *pVVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  SPIRExpression *pSVar5;
  SPIRType *pSVar6;
  const_iterator cVar7;
  StorageClass *pSVar8;
  uint32_t local_1c;
  
  local_1c = ptr;
  pSVar4 = maybe_get_backing_variable(this,ptr);
  pVVar1 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
  if ((pVVar1[ptr].type == TypeExpression) &&
     (pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + ptr),
     pSVar5->access_chain == false)) {
    cVar7 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->forced_temporaries)._M_h,&local_1c);
    if (cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      cVar7 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->forwarded_temporaries)._M_h,&local_1c);
      bVar2 = cVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0;
      goto LAB_002b6809;
    }
  }
  else {
    bVar2 = false;
LAB_002b6809:
    if ((pSVar4 != (SPIRVariable *)0x0) && (!bVar2)) {
      if (pSVar4->storage != StorageClassUniform) {
        return pSVar4->storage;
      }
      pSVar6 = Variant::get<spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar4->super_IVariant).field_0xc);
      bVar2 = ParsedIR::has_decoration
                        (&this->ir,(ID)(pSVar6->super_IVariant).self.id,DecorationBufferBlock);
      if (bVar2) {
        return StorageClassStorageBuffer;
      }
      pSVar8 = &pSVar4->storage;
      goto LAB_002b6891;
    }
  }
  uVar3 = expression_type_id(this,local_1c);
  pSVar6 = Variant::get<spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar3);
  pSVar8 = &pSVar6->storage;
LAB_002b6891:
  return *pSVar8;
}

Assistant:

StorageClass Compiler::get_expression_effective_storage_class(uint32_t ptr)
{
	auto *var = maybe_get_backing_variable(ptr);

	// If the expression has been lowered to a temporary, we need to use the Generic storage class.
	// We're looking for the effective storage class of a given expression.
	// An access chain or forwarded OpLoads from such access chains
	// will generally have the storage class of the underlying variable, but if the load was not forwarded
	// we have lost any address space qualifiers.
	bool forced_temporary = ir.ids[ptr].get_type() == TypeExpression && !get<SPIRExpression>(ptr).access_chain &&
	                        (forced_temporaries.count(ptr) != 0 || forwarded_temporaries.count(ptr) == 0);

	if (var && !forced_temporary)
	{
		// Normalize SSBOs to StorageBuffer here.
		if (var->storage == StorageClassUniform &&
		    has_decoration(get<SPIRType>(var->basetype).self, DecorationBufferBlock))
			return StorageClassStorageBuffer;
		else
			return var->storage;
	}
	else
		return expression_type(ptr).storage;
}